

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::CompressString(cmCTest *this,string *str)

{
  Bytef *pBVar1;
  int iVar2;
  ostream *poVar3;
  uInt uVar4;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  char *local_238 [4];
  z_stream_conflict local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> base64EncodedBuffer;
  
  local_218.zalloc = (alloc_func)0x0;
  local_218.zfree = (free_func)0x0;
  local_218.opaque = (voidpf)0x0;
  iVar2 = cm_zlib_deflateInit_(&local_218,-1,"1.2.3",0x70);
  if (iVar2 == 0) {
    pBVar1 = (Bytef *)(str->_M_dataplus)._M_p;
    uVar4 = (uInt)((((double)CONCAT44(0x45300000,(int)(str->_M_string_length >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)str->_M_string_length) - 4503599627370496.0)) *
                   1.001 + 13.0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out,(long)(int)uVar4,(allocator_type *)&base64EncodedBuffer);
    local_218.avail_in = (uInt)str->_M_string_length;
    local_218.next_out =
         out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_218.next_in = pBVar1;
    local_218.avail_out = uVar4;
    iVar2 = cm_zlib_deflate(&local_218,4);
    bVar5 = iVar2 == 1;
    if (bVar5) {
      cm_zlib_deflateEnd(&local_218);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&base64EncodedBuffer,(long)((int)(uVar4 * 3) / 2),(allocator_type *)local_238);
      cmsysBase64_Encode(out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_218.total_out,
                         base64EncodedBuffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,1);
      std::__cxx11::string::assign
                ((char *)str,
                 (ulong)base64EncodedBuffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&base64EncodedBuffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&base64EncodedBuffer);
      poVar3 = std::operator<<((ostream *)&base64EncodedBuffer,"Error during gzip compression.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
          0xc0c,local_238[0],false);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base64EncodedBuffer);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmCTest::CompressString(std::string& str)
{
  int ret;
  z_stream strm;

  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, -1); // default compression level
  if (ret != Z_OK) {
    return false;
  }

  unsigned char* in =
    reinterpret_cast<unsigned char*>(const_cast<char*>(str.c_str()));
  // zlib makes the guarantee that this is the maximum output size
  int outSize =
    static_cast<int>(static_cast<double>(str.size()) * 1.001 + 13.0);
  std::vector<unsigned char> out(outSize);

  strm.avail_in = static_cast<uInt>(str.size());
  strm.next_in = in;
  strm.avail_out = outSize;
  strm.next_out = &out[0];
  ret = deflate(&strm, Z_FINISH);

  if (ret != Z_STREAM_END) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Error during gzip compression." << std::endl);
    return false;
  }

  (void)deflateEnd(&strm);

  // Now base64 encode the resulting binary string
  std::vector<unsigned char> base64EncodedBuffer((outSize * 3) / 2);

  size_t rlen =
    cmsysBase64_Encode(&out[0], strm.total_out, &base64EncodedBuffer[0], 1);

  str.assign(reinterpret_cast<char*>(&base64EncodedBuffer[0]), rlen);

  return true;
}